

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_IntallLibrary(void)

{
  Vec_Str_t *p;
  char *pcVar1;
  Mio_Library_t *pLib_00;
  Vec_Str_t *vLibStr;
  int i;
  Mio_Library_t *pLib;
  
  p = Vec_StrAlloc(1000);
  for (vLibStr._4_4_ = 0; pLibStr[vLibStr._4_4_] != (char *)0x0; vLibStr._4_4_ = vLibStr._4_4_ + 1)
  {
    Vec_StrAppend(p,pLibStr[vLibStr._4_4_]);
  }
  Vec_StrPush(p,'\0');
  pcVar1 = Vec_StrArray(p);
  pLib_00 = Mio_LibraryReadBuffer(pcVar1,0,(st__table *)0x0,0);
  pcVar1 = Abc_UtilStrsav("iccad17.genlib");
  Mio_LibrarySetName(pLib_00,pcVar1);
  Mio_UpdateGenlib(pLib_00);
  Vec_StrFree(p);
  return;
}

Assistant:

void Acb_IntallLibrary()
{
    extern Mio_Library_t * Mio_LibraryReadBuffer( char * pBuffer, int fExtendedFormat, st__table * tExcludeGate, int fVerbose );
    Mio_Library_t * pLib;
    int i;
    // create library string
    Vec_Str_t * vLibStr = Vec_StrAlloc( 1000 );
    for ( i = 0; pLibStr[i]; i++ )
        Vec_StrAppend( vLibStr, pLibStr[i] );
    Vec_StrPush( vLibStr, '\0' );
    // create library
    pLib = Mio_LibraryReadBuffer( Vec_StrArray(vLibStr), 0, NULL, 0 );
    Mio_LibrarySetName( pLib, Abc_UtilStrsav("iccad17.genlib") );
    Mio_UpdateGenlib( pLib );
    Vec_StrFree( vLibStr );
}